

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_tests.cpp
# Opt level: O1

void __thiscall pool_tests::basic_allocating::test_method(basic_allocating *this)

{
  ListNode *pLVar1;
  PoolResource<8UL,_8UL> *resource_00;
  PoolResource<8UL,_8UL> *resource_01;
  PoolResource<8UL,_8UL> *resource_02;
  PoolResource<8UL,_8UL> *resource_03;
  PoolResource<8UL,_8UL> *resource_04;
  PoolResource<8UL,_8UL> *resource_05;
  PoolResource<8UL,_8UL> *resource_06;
  PoolResource<8UL,_8UL> *resource_07;
  PoolResource<8UL,_8UL> *resource_08;
  PoolResource<8UL,_8UL> *resource_09;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  void *b;
  void *block;
  size_t expected_bytes_available;
  PoolResource<8UL,_8UL> resource;
  check_type cVar4;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  ListNode *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  ListNode *local_100;
  char *local_f8;
  char *local_f0;
  binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
  local_e8;
  lazy_ostream local_d8;
  undefined1 *local_c8;
  binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
  *local_c0;
  assertion_result local_b8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  void *local_80;
  PoolResource<8UL,_8UL> local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  PoolResource<8UL,_8UL>::PoolResource(&local_78,0x40000);
  PoolResourceTester::CheckAllDataAccountedFor<8ul,8ul>(&local_78);
  local_80 = (void *)local_78.m_chunk_size_bytes;
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1b;
  file.m_begin = (iterator)&local_90;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_a0,msg);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(local_78.m_available_memory_end + -(long)local_78.m_available_memory_it);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_80;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_b8,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
              *)&local_168,false);
  local_e8._0_8_ =
       "expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource)";
  local_e8.m_rhs = (unsigned_long *)0xebabc5;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_f0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_f8,0x1b);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  local_100 = (ListNode *)PoolResource<8UL,_8UL>::Allocate(&local_78,8,8);
  local_80 = (void *)((long)local_80 - 8);
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x20;
  file_00.m_begin = (iterator)&local_110;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_120,
             msg_00);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(local_78.m_available_memory_end + -(long)local_78.m_available_memory_it);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_80;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_b8,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
              *)&local_168,false);
  local_e8._0_8_ =
       "expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource)";
  local_e8.m_rhs = (unsigned_long *)0xebabc5;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_128 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_130,0x20);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x22;
  file_01.m_begin = (iterator)&local_140;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_150,
             msg_01);
  PoolResourceTester::FreeListSizes<8ul,8ul>(&local_168,(PoolResourceTester *)&local_78,resource_00)
  ;
  local_e8.m_rhs =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  local_e8._0_8_ = local_e8._0_8_ & 0xffffffff00000000;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
  ::evaluate(&local_b8,&local_e8,false);
  local_c0 = (binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
              *)&local_178;
  local_178 = "0 == PoolResourceTester::FreeListSizes(resource)[1]";
  local_170 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_180 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_188,0x22);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if ((void **)local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start != (void **)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_100->m_next = local_78.m_free_lists._M_elems[1];
  local_78.m_free_lists._M_elems[1] = local_100;
  PoolResourceTester::CheckAllDataAccountedFor<8ul,8ul>(&local_78);
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x25;
  file_02.m_begin = (iterator)&local_198;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1a8,
             msg_02);
  PoolResourceTester::FreeListSizes<8ul,8ul>(&local_168,(PoolResourceTester *)&local_78,resource_01)
  ;
  local_e8.m_rhs =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  local_e8.m_lhs.m_value = 1;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
  ::evaluate(&local_b8,&local_e8,false);
  local_178 = "1 == PoolResourceTester::FreeListSizes(resource)[1]";
  local_170 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
              *)&local_178;
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_1b0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_1b8,0x25);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if ((void **)local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start != (void **)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1c0 = (ListNode *)PoolResource<8UL,_8UL>::Allocate(&local_78,8,1);
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x29;
  file_03.m_begin = (iterator)&local_1d0;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1e0,
             msg_03);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_1c0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_100;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<void_*&>,_void_*&,_boost::test_tools::assertion::op::EQ<void_*,_void_*,_void>_>
  ::evaluate(&local_b8,
             (binary_expr<boost::test_tools::assertion::value_expr<void_*&>,_void_*&,_boost::test_tools::assertion::op::EQ<void_*,_void_*,_void>_>
              *)&local_168,false);
  local_e8._0_8_ = "b == block";
  local_e8.m_rhs = (unsigned_long *)0xebac38;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_1e8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_1f0,0x29);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x2a;
  file_04.m_begin = (iterator)&local_200;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_210,
             msg_04);
  PoolResourceTester::FreeListSizes<8ul,8ul>(&local_168,(PoolResourceTester *)&local_78,resource_02)
  ;
  local_e8.m_rhs =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  local_e8._0_8_ = local_e8._0_8_ & 0xffffffff00000000;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
  ::evaluate(&local_b8,&local_e8,false);
  local_178 = "0 == PoolResourceTester::FreeListSizes(resource)[1]";
  local_170 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
              *)&local_178;
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_218 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_220,0x2a);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if ((ListNode **)
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (ListNode **)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x2b;
  file_05.m_begin = (iterator)&local_230;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_240,
             msg_05);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(local_78.m_available_memory_end + -(long)local_78.m_available_memory_it);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_80;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_b8,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
              *)&local_168,false);
  local_e8._0_8_ =
       "expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource)";
  local_e8.m_rhs = (unsigned_long *)0xebabc5;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_248 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_250,0x2b);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  local_100->m_next = local_78.m_free_lists._M_elems[1];
  local_78.m_free_lists._M_elems[1] = local_100;
  PoolResourceTester::CheckAllDataAccountedFor<8ul,8ul>(&local_78);
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x2f;
  file_06.m_begin = (iterator)&local_260;
  msg_06.m_end = pvVar3;
  msg_06.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_270,
             msg_06);
  PoolResourceTester::FreeListSizes<8ul,8ul>(&local_168,(PoolResourceTester *)&local_78,resource_03)
  ;
  local_e8.m_rhs =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  local_e8.m_lhs.m_value = 1;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
  ::evaluate(&local_b8,&local_e8,false);
  local_178 = "1 == PoolResourceTester::FreeListSizes(resource)[1]";
  local_170 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
              *)&local_178;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_278 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_280,0x2f);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if ((void **)local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start != (void **)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x30;
  file_07.m_begin = (iterator)&local_290;
  msg_07.m_end = pvVar3;
  msg_07.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2a0,
             msg_07);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(local_78.m_available_memory_end + -(long)local_78.m_available_memory_it);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_80;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_b8,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
              *)&local_168,false);
  local_e8._0_8_ =
       "expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource)";
  local_e8.m_rhs = (unsigned_long *)0xebabc5;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_2a8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_2b0,0x30);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  local_1c0 = (ListNode *)operator_new(8,0x10);
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x34;
  file_08.m_begin = (iterator)&local_2c0;
  msg_08.m_end = pvVar3;
  msg_08.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2d0,
             msg_08);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_1c0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_100;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<void_*&>,_void_*&,_boost::test_tools::assertion::op::NE<void_*,_void_*,_void>_>
  ::evaluate(&local_b8,
             (binary_expr<boost::test_tools::assertion::value_expr<void_*&>,_void_*&,_boost::test_tools::assertion::op::NE<void_*,_void_*,_void>_>
              *)&local_168,false);
  local_e8._0_8_ = "b != block";
  local_e8.m_rhs = (unsigned_long *)0xebac43;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_2d8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_2e0,0x34);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  local_100 = local_1c0;
  PoolResourceTester::CheckAllDataAccountedFor<8ul,8ul>(&local_78);
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x37;
  file_09.m_begin = (iterator)&local_2f0;
  msg_09.m_end = pvVar3;
  msg_09.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_300,
             msg_09);
  PoolResourceTester::FreeListSizes<8ul,8ul>(&local_168,(PoolResourceTester *)&local_78,resource_04)
  ;
  local_e8.m_rhs =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  local_e8.m_lhs.m_value = 1;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
  ::evaluate(&local_b8,&local_e8,false);
  local_178 = "1 == PoolResourceTester::FreeListSizes(resource)[1]";
  local_170 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
              *)&local_178;
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_308 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_310,0x37);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if ((ListNode **)
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (ListNode **)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x38;
  file_10.m_begin = (iterator)&local_320;
  msg_10.m_end = pvVar3;
  msg_10.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_330,
             msg_10);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(local_78.m_available_memory_end + -(long)local_78.m_available_memory_it);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_80;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_b8,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
              *)&local_168,false);
  local_e8._0_8_ =
       "expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource)";
  local_e8.m_rhs = (unsigned_long *)0xebabc5;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_338 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_340,0x38);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  operator_delete(local_100,0x10);
  PoolResourceTester::CheckAllDataAccountedFor<8ul,8ul>(&local_78);
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x3c;
  file_11.m_begin = (iterator)&local_350;
  msg_11.m_end = pvVar3;
  msg_11.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_360,
             msg_11);
  PoolResourceTester::FreeListSizes<8ul,8ul>(&local_168,(PoolResourceTester *)&local_78,resource_05)
  ;
  local_e8.m_rhs =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  local_e8.m_lhs.m_value = 1;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
  ::evaluate(&local_b8,&local_e8,false);
  local_178 = "1 == PoolResourceTester::FreeListSizes(resource)[1]";
  local_170 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
              *)&local_178;
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_368 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_370,0x3c);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if ((void **)local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start != (void **)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x3d;
  file_12.m_begin = (iterator)&local_380;
  msg_12.m_end = pvVar3;
  msg_12.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_390,
             msg_12);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(local_78.m_available_memory_end + -(long)local_78.m_available_memory_it);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_80;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_b8,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
              *)&local_168,false);
  local_e8._0_8_ =
       "expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource)";
  local_e8.m_rhs = (unsigned_long *)0xebabc5;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_398 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_3a0,0x3d);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  local_100 = (ListNode *)operator_new(0x10,8);
  PoolResourceTester::CheckAllDataAccountedFor<8ul,8ul>(&local_78);
  local_3b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x42;
  file_13.m_begin = (iterator)&local_3b0;
  msg_13.m_end = pvVar3;
  msg_13.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3c0,
             msg_13);
  PoolResourceTester::FreeListSizes<8ul,8ul>(&local_168,(PoolResourceTester *)&local_78,resource_06)
  ;
  local_e8.m_rhs =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  local_e8.m_lhs.m_value = 1;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
  ::evaluate(&local_b8,&local_e8,false);
  local_178 = "1 == PoolResourceTester::FreeListSizes(resource)[1]";
  local_170 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
              *)&local_178;
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_3c8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_3d0,0x42);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if ((void **)local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start != (void **)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_3e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x43;
  file_14.m_begin = (iterator)&local_3e0;
  msg_14.m_end = pvVar3;
  msg_14.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3f0,
             msg_14);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(local_78.m_available_memory_end + -(long)local_78.m_available_memory_it);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_80;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_b8,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
              *)&local_168,false);
  local_e8._0_8_ =
       "expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource)";
  local_e8.m_rhs = (unsigned_long *)0xebabc5;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_400 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_3f8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_400,0x43);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  operator_delete(local_100,8);
  PoolResourceTester::CheckAllDataAccountedFor<8ul,8ul>(&local_78);
  local_410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x47;
  file_15.m_begin = (iterator)&local_410;
  msg_15.m_end = pvVar3;
  msg_15.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_420,
             msg_15);
  PoolResourceTester::FreeListSizes<8ul,8ul>(&local_168,(PoolResourceTester *)&local_78,resource_07)
  ;
  local_e8.m_rhs =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  local_e8.m_lhs.m_value = 1;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
  ::evaluate(&local_b8,&local_e8,false);
  local_178 = "1 == PoolResourceTester::FreeListSizes(resource)[1]";
  local_170 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
              *)&local_178;
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_428 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_430,0x47);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if ((void **)local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start != (void **)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x48;
  file_16.m_begin = (iterator)&local_440;
  msg_16.m_end = pvVar3;
  msg_16.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_450,
             msg_16);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(local_78.m_available_memory_end + -(long)local_78.m_available_memory_it);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_80;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_b8,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
              *)&local_168,false);
  local_e8._0_8_ =
       "expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource)";
  local_e8.m_rhs = (unsigned_long *)0xebabc5;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_460 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_458 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_460,0x48);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  pLVar1 = (ListNode *)PoolResource<8UL,_8UL>::Allocate(&local_78,0,1);
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x4d;
  file_17.m_begin = (iterator)&local_470;
  msg_17.m_end = pvVar3;
  msg_17.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_480,
             msg_17);
  PoolResourceTester::FreeListSizes<8ul,8ul>(&local_168,(PoolResourceTester *)&local_78,resource_08)
  ;
  local_e8.m_rhs =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  local_e8._0_8_ = local_e8._0_8_ & 0xffffffff00000000;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
  ::evaluate(&local_b8,&local_e8,false);
  local_178 = "0 == PoolResourceTester::FreeListSizes(resource)[1]";
  local_170 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
              *)&local_178;
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_488 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_490,0x4d);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if ((void **)local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start != (void **)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x4e;
  file_18.m_begin = (iterator)&local_4a0;
  msg_18.m_end = pvVar3;
  msg_18.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_4b0,
             msg_18);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(local_78.m_available_memory_end + -(long)local_78.m_available_memory_it);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_80;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_b8,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
              *)&local_168,false);
  local_e8._0_8_ =
       "expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource)";
  local_e8.m_rhs = (unsigned_long *)0xebabc5;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_4c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_4b8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_4c0,0x4e);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  pLVar1->m_next = local_78.m_free_lists._M_elems[1];
  local_78.m_free_lists._M_elems[1] = pLVar1;
  PoolResourceTester::CheckAllDataAccountedFor<8ul,8ul>(&local_78);
  local_4d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x52;
  file_19.m_begin = (iterator)&local_4d0;
  msg_19.m_end = pvVar3;
  msg_19.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_4e0,
             msg_19);
  PoolResourceTester::FreeListSizes<8ul,8ul>(&local_168,(PoolResourceTester *)&local_78,resource_09)
  ;
  local_e8.m_rhs =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  local_e8.m_lhs.m_value = 1;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
  ::evaluate(&local_b8,&local_e8,false);
  local_178 = "1 == PoolResourceTester::FreeListSizes(resource)[1]";
  local_170 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
              *)&local_178;
  local_4f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_4e8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,_cVar4,(size_t)&local_4f0,0x52);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if ((void **)local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start != (void **)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x53;
  file_20.m_begin = (iterator)&local_500;
  msg_20.m_end = pvVar3;
  msg_20.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_510,
             msg_20);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(local_78.m_available_memory_end + -(long)local_78.m_available_memory_it);
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_80;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_b8,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
              *)&local_168,false);
  local_e8._0_8_ =
       "expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource)";
  local_e8.m_rhs = (unsigned_long *)0xebabc5;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0xe,WARN,0xebaafe,(size_t)&stack0xfffffffffffffae0,0x53);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  PoolResource<8UL,_8UL>::~PoolResource(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(basic_allocating)
{
    auto resource = PoolResource<8, 8>();
    PoolResourceTester::CheckAllDataAccountedFor(resource);

    // first chunk is already allocated
    size_t expected_bytes_available = resource.ChunkSizeBytes();
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));

    // chunk is used, no more allocation
    void* block = resource.Allocate(8, 8);
    expected_bytes_available -= 8;
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));

    BOOST_TEST(0 == PoolResourceTester::FreeListSizes(resource)[1]);
    resource.Deallocate(block, 8, 8);
    PoolResourceTester::CheckAllDataAccountedFor(resource);
    BOOST_TEST(1 == PoolResourceTester::FreeListSizes(resource)[1]);

    // alignment is too small, but the best fitting freelist is used. Nothing is allocated.
    void* b = resource.Allocate(8, 1);
    BOOST_TEST(b == block); // we got the same block of memory as before
    BOOST_TEST(0 == PoolResourceTester::FreeListSizes(resource)[1]);
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));

    resource.Deallocate(block, 8, 1);
    PoolResourceTester::CheckAllDataAccountedFor(resource);
    BOOST_TEST(1 == PoolResourceTester::FreeListSizes(resource)[1]);
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));

    // can't use resource because alignment is too big, allocate system memory
    b = resource.Allocate(8, 16);
    BOOST_TEST(b != block);
    block = b;
    PoolResourceTester::CheckAllDataAccountedFor(resource);
    BOOST_TEST(1 == PoolResourceTester::FreeListSizes(resource)[1]);
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));

    resource.Deallocate(block, 8, 16);
    PoolResourceTester::CheckAllDataAccountedFor(resource);
    BOOST_TEST(1 == PoolResourceTester::FreeListSizes(resource)[1]);
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));

    // can't use chunk because size is too big
    block = resource.Allocate(16, 8);
    PoolResourceTester::CheckAllDataAccountedFor(resource);
    BOOST_TEST(1 == PoolResourceTester::FreeListSizes(resource)[1]);
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));

    resource.Deallocate(block, 16, 8);
    PoolResourceTester::CheckAllDataAccountedFor(resource);
    BOOST_TEST(1 == PoolResourceTester::FreeListSizes(resource)[1]);
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));

    // it's possible that 0 bytes are allocated, make sure this works. In that case the call is forwarded to operator new
    // 0 bytes takes one entry from the first freelist
    void* p = resource.Allocate(0, 1);
    BOOST_TEST(0 == PoolResourceTester::FreeListSizes(resource)[1]);
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));

    resource.Deallocate(p, 0, 1);
    PoolResourceTester::CheckAllDataAccountedFor(resource);
    BOOST_TEST(1 == PoolResourceTester::FreeListSizes(resource)[1]);
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));
}